

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O1

REF_STATUS
ref_import_bin_ugrid_bound_tag
          (REF_CELL ref_cell,REF_INT ncell,FILE *file,REF_BOOL swap,REF_BOOL fat)

{
  int iVar1;
  REF_INT *pRVar2;
  uint uVar3;
  uint uVar4;
  REF_INT *chunk;
  uint n;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  if (0 < ncell) {
    iVar1 = ref_cell->node_per;
    uVar3 = 1000000;
    if (ncell < 1000000) {
      uVar3 = ncell;
    }
    chunk = (REF_INT *)malloc((ulong)(uVar3 * 4));
    if (chunk == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x210,"ref_import_bin_ugrid_bound_tag","malloc tag of REF_INT NULL");
      return 2;
    }
    iVar8 = 0;
    do {
      uVar6 = ncell - iVar8;
      n = uVar6;
      if ((int)uVar3 < (int)uVar6) {
        n = uVar3;
      }
      uVar4 = ref_import_bin_ugrid_chunk(file,swap,fat,n,chunk);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x214,"ref_import_bin_ugrid_bound_tag",(ulong)uVar4,"tag");
        return uVar4;
      }
      if (0 < (int)uVar6) {
        pRVar2 = ref_cell->c2n;
        uVar5 = 1;
        if (1 < (int)n) {
          uVar5 = (ulong)n;
        }
        uVar7 = 0;
        do {
          pRVar2[(long)(iVar8 + (int)uVar7) * (long)ref_cell->size_per + (long)iVar1] = chunk[uVar7]
          ;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      iVar8 = iVar8 + n;
    } while (iVar8 < ncell);
    free(chunk);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_bound_tag(
    REF_CELL ref_cell, REF_INT ncell, FILE *file, REF_BOOL swap, REF_BOOL fat) {
  REF_INT node_per, max_chunk, nread, chunk, cell;
  REF_INT *tag;

  if (0 < ncell) {
    node_per = ref_cell_node_per(ref_cell);
    max_chunk = MIN(1000000, ncell);
    ref_malloc(tag, max_chunk, REF_INT);
    nread = 0;
    while (nread < ncell) {
      chunk = MIN(max_chunk, ncell - nread);
      RSS(ref_import_bin_ugrid_chunk(file, swap, fat, chunk, tag), "tag");
      for (cell = 0; cell < chunk; cell++) {
        ref_cell_c2n(ref_cell, node_per, nread + cell) = tag[cell];
      }
      nread += chunk;
    }
    ref_free(tag);
  }

  return REF_SUCCESS;
}